

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_expression.c
# Opt level: O0

AST * parse_unary_expression(Translation_Data *translation_data,Scope *scope)

{
  char cVar1;
  AST *pAVar2;
  Queue *pQVar3;
  AST_Unary_Expression *hold;
  Scope *scope_local;
  Translation_Data *translation_data_local;
  
  if (translation_data->tokens->size == 0) {
    push_translation_error("expected something here",translation_data);
    translation_data_local = (Translation_Data *)get_error_tree((AST *)0x0);
  }
  else {
    switch(*translation_data->tokens->first->data) {
    case 0x1b:
      chomp(translation_data);
      cVar1 = get_and_check(translation_data,KW_OPEN_NORMAL);
      if (cVar1 == '\0') {
        pAVar2 = parse_unary_expression(translation_data,scope);
        translation_data_local = (Translation_Data *)get_unary_expression_tree(pAVar2,OP_SIZEOF);
      }
      else {
        translation_data_local = (Translation_Data *)get_unary_expression_tree((AST *)0x0,OP_CAST);
        pQVar3 = (Queue *)parse_type_name(translation_data,scope);
        translation_data_local->errors = pQVar3;
        pAVar2 = parse_unary_expression(translation_data,scope);
        translation_data_local->number_of_errors_when_last_checked = (size_t)pAVar2;
      }
      break;
    default:
      translation_data_local = (Translation_Data *)parse_postfix_expression(translation_data,scope);
      break;
    case 0x21:
      chomp(translation_data);
      pAVar2 = parse_cast_expression(translation_data,scope);
      translation_data_local = (Translation_Data *)get_unary_expression_tree(pAVar2,OP_LOGICAL_NOT);
      break;
    case 0x24:
      chomp(translation_data);
      pAVar2 = parse_cast_expression(translation_data,scope);
      translation_data_local = (Translation_Data *)get_unary_expression_tree(pAVar2,OP_ADDR_OF);
      break;
    case 0x28:
      chomp(translation_data);
      pAVar2 = parse_cast_expression(translation_data,scope);
      translation_data_local = (Translation_Data *)get_unary_expression_tree(pAVar2,OP_DEREFERENCE);
      break;
    case 0x29:
      chomp(translation_data);
      pAVar2 = parse_cast_expression(translation_data,scope);
      translation_data_local = (Translation_Data *)get_unary_expression_tree(pAVar2,OP_UNARY_PLUS);
      break;
    case 0x2b:
      chomp(translation_data);
      pAVar2 = parse_cast_expression(translation_data,scope);
      translation_data_local = (Translation_Data *)get_unary_expression_tree(pAVar2,OP_UNARY_MINUS);
      break;
    case 0x3c:
      chomp(translation_data);
      pAVar2 = parse_cast_expression(translation_data,scope);
      translation_data_local = (Translation_Data *)get_unary_expression_tree(pAVar2,OP_BITWISE_NOT);
      break;
    case 0x3d:
      chomp(translation_data);
      pAVar2 = parse_unary_expression(translation_data,scope);
      translation_data_local = (Translation_Data *)get_unary_expression_tree(pAVar2,OP_PREFIX_INC);
      break;
    case 0x3e:
      chomp(translation_data);
      pAVar2 = parse_unary_expression(translation_data,scope);
      translation_data_local = (Translation_Data *)get_unary_expression_tree(pAVar2,OP_PREFIX_DEC);
    }
  }
  return (AST *)translation_data_local;
}

Assistant:

struct AST* parse_unary_expression(struct Translation_Data *translation_data,struct Scope *scope)
{
	struct AST_Unary_Expression *hold;

	if(translation_data->tokens->size==0)
	{
		/*TODO error*/
		push_translation_error("expected something here",translation_data);
		return (struct AST*)get_error_tree(NULL);
	}

	/*TODO make it iterative*/
	switch(((struct token*)translation_data->tokens->first->data)->type)
	{
		case KW_PLUSPLUS:
			chomp(translation_data);
			return (struct AST*)get_unary_expression_tree(parse_unary_expression(translation_data,scope),OP_PREFIX_INC);
		case KW_MINUSMINUS:
			chomp(translation_data);
			return (struct AST*)get_unary_expression_tree(parse_unary_expression(translation_data,scope),OP_PREFIX_DEC);
		case KW_PLUS:
			chomp(translation_data);
			return (struct AST*)get_unary_expression_tree(parse_cast_expression(translation_data,scope),OP_UNARY_PLUS);
		case KW_MINUS:
			chomp(translation_data);
			return (struct AST*)get_unary_expression_tree(parse_cast_expression(translation_data,scope),OP_UNARY_MINUS);
		case KW_EXCLAMATION:
			chomp(translation_data);
			return (struct AST*)get_unary_expression_tree(parse_cast_expression(translation_data,scope),OP_LOGICAL_NOT);
		case KW_TILDE:
			chomp(translation_data);
			return (struct AST*)get_unary_expression_tree(parse_cast_expression(translation_data,scope),OP_BITWISE_NOT);
		case KW_STAR:
			chomp(translation_data);
			return (struct AST*)get_unary_expression_tree(parse_cast_expression(translation_data,scope),OP_DEREFERENCE);
		case KW_AND:
			chomp(translation_data);
			return (struct AST*)get_unary_expression_tree(parse_cast_expression(translation_data,scope),OP_ADDR_OF);
		case KW_SIZEOF:
			chomp(translation_data);
			if(get_and_check(translation_data,KW_OPEN_NORMAL))
			{
				hold=get_unary_expression_tree(NULL,OP_CAST);
				hold->value_type=parse_type_name(translation_data,scope);
				hold->operand=parse_unary_expression(translation_data,scope);
				return (struct AST*)hold;
			}else
			{
				return (struct AST*)get_unary_expression_tree(parse_unary_expression(translation_data,scope),OP_SIZEOF);
			}
		default:
			return parse_postfix_expression(translation_data,scope);
	}

}